

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

void __thiscall absl::flags_internal::FlagImpl::Write(FlagImpl *this,void *src)

{
  Mutex *this_00;
  char *pcVar1;
  void *pvVar2;
  AlphaNum *in_R9;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  string src_as_str;
  unique_ptr<void,_absl::flags_internal::DynValueDeleter> local_140;
  string ignored_error;
  string_view local_110 [3];
  string local_e0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  this_00 = DataGuard(this);
  Mutex::Lock(this_00);
  pcVar1 = (char *)(*this->op_)(kFastTypeId,(void *)0x0,(void *)0x0,(void *)0x0);
  iVar3 = (int)pcVar1;
  iVar4 = (int)((ulong)pcVar1 >> 0x20);
  auVar10._0_4_ = -(uint)(iVar3 == 0x152eb8);
  auVar10._4_4_ = -(uint)(iVar4 == 0);
  auVar10._8_4_ = -(uint)(iVar3 == 0x152eb9);
  auVar10._12_4_ = -(uint)(iVar4 == 0);
  auVar12._4_4_ = auVar10._0_4_;
  auVar12._0_4_ = auVar10._4_4_;
  auVar12._8_4_ = auVar10._12_4_;
  auVar12._12_4_ = auVar10._8_4_;
  auVar9._0_4_ = -(uint)(iVar3 == 0x152eb6);
  auVar9._4_4_ = -(uint)(iVar4 == 0);
  auVar9._8_4_ = -(uint)(iVar3 == 0x152eb7);
  auVar9._12_4_ = -(uint)(iVar4 == 0);
  auVar11._4_4_ = auVar9._0_4_;
  auVar11._0_4_ = auVar9._4_4_;
  auVar11._8_4_ = auVar9._12_4_;
  auVar11._12_4_ = auVar9._8_4_;
  auVar12 = packssdw(auVar11 & auVar9,auVar12 & auVar10);
  auVar8._0_4_ = -(uint)(iVar3 == 0x152eb4);
  auVar8._4_4_ = -(uint)(iVar4 == 0);
  auVar8._8_4_ = -(uint)(iVar3 == 0x152eb5);
  auVar8._12_4_ = -(uint)(iVar4 == 0);
  auVar7._4_4_ = auVar8._0_4_;
  auVar7._0_4_ = auVar8._4_4_;
  auVar7._8_4_ = auVar8._12_4_;
  auVar7._12_4_ = auVar8._8_4_;
  auVar6._0_4_ = -(uint)(iVar3 == 0x15288b);
  auVar6._4_4_ = -(uint)(iVar4 == 0);
  auVar6._8_4_ = -(uint)(iVar3 == 0x152eb3);
  auVar6._12_4_ = -(uint)(iVar4 == 0);
  auVar5._4_4_ = auVar6._0_4_;
  auVar5._0_4_ = auVar6._4_4_;
  auVar5._8_4_ = auVar6._12_4_;
  auVar5._12_4_ = auVar6._8_4_;
  auVar6 = packssdw(auVar5 & auVar6,auVar7 & auVar8);
  auVar6 = packssdw(auVar6,auVar12);
  if (((((((((((auVar6 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar6 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar6 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar6 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar6 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar6 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar6 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar6[0xf]) &&
       (pcVar1 != "")) && (pcVar1 != "")) && (((pcVar1 != "" && (pcVar1 != "")) && (pcVar1 != ""))))
  {
    pvVar2 = Clone(this->op_,src);
    DynValueDeleter::DynValueDeleter((DynValueDeleter *)&local_140,this->op_);
    ignored_error._M_dataplus._M_p = (pointer)&ignored_error.field_2;
    ignored_error._M_string_length = 0;
    ignored_error.field_2._M_local_buf[0] = '\0';
    src_as_str._M_dataplus._M_p = (pointer)&src_as_str.field_2;
    src_as_str._M_string_length = 0;
    src_as_str.field_2._M_local_buf[0] = '\0';
    local_140._M_t.super___uniq_ptr_impl<void,_absl::flags_internal::DynValueDeleter>._M_t.
    super__Tuple_impl<0UL,_void_*,_absl::flags_internal::DynValueDeleter>.
    super__Head_base<0UL,_void_*,_false>._M_head_impl = pvVar2;
    (*this->op_)(kUnparse,src,&src_as_str,(void *)0x0);
    local_110[0]._M_str = src_as_str._M_dataplus._M_p;
    local_110[0]._M_len = src_as_str._M_string_length;
    pvVar2 = (*this->op_)(kParse,local_110,pvVar2,&ignored_error);
    if (pvVar2 == (void *)0x0) {
      local_110[0] = NullSafeStringView("Attempt to set flag \'");
      local_60.piece_ = Name(this);
      local_90.piece_ = NullSafeStringView("\' to invalid value ");
      local_c0.piece_._M_len = src_as_str._M_string_length;
      local_c0.piece_._M_str = src_as_str._M_dataplus._M_p;
      StrCat_abi_cxx11_(&local_e0,(absl *)local_110,&local_60,&local_90,&local_c0,in_R9);
      (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
                (2,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/flags/internal/flag.cc"
                 ,0x200,&local_e0);
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::unique_ptr<void,_absl::flags_internal::DynValueDeleter>::~unique_ptr(&local_140);
  }
  StoreValue(this,src);
  Mutex::Unlock(this_00);
  return;
}

Assistant:

void FlagImpl::Write(const void* src) {
  absl::MutexLock l(DataGuard());

  if (ShouldValidateFlagValue(flags_internal::FastTypeId(op_))) {
    std::unique_ptr<void, DynValueDeleter> obj{flags_internal::Clone(op_, src),
                                               DynValueDeleter{op_}};
    std::string ignored_error;
    std::string src_as_str = flags_internal::Unparse(op_, src);
    if (!flags_internal::Parse(op_, src_as_str, obj.get(), &ignored_error)) {
      ABSL_INTERNAL_LOG(ERROR, absl::StrCat("Attempt to set flag '", Name(),
                                            "' to invalid value ", src_as_str));
    }
  }

  StoreValue(src);
}